

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  string_view *psVar1;
  char cVar2;
  string_view name;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  undefined7 extraout_var;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  Option *pOVar7;
  runtime_error *this_00;
  size_type sVar8;
  _Rb_tree_color _Var9;
  string *__return_storage_ptr__;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar10;
  long lVar11;
  pointer pbVar12;
  string_view name_00;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view arg_00;
  format_args args_00;
  string_view value_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  bool hadUnknowns;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  ParseOptions local_170;
  uint local_16c;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_168;
  ulong local_160;
  string nearest;
  string result;
  _Base_ptr local_f8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_f0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_e8;
  _Base_ptr local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  string local_c8;
  string_view value;
  pointer local_78;
  size_type local_70;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> local_60
  ;
  string local_50;
  
  local_60 = args;
  if ((this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"No options defined");
LAB_00195d2a:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_170 = options;
  if (((uint)options >> 8 & 1) == 0) {
    if ((basic_string_view<char,_std::char_traits<char>_> *)args.size_ ==
        (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Expected at least one argument");
      goto LAB_00195d2a;
    }
    std::filesystem::__cxx11::
    u8path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path,char>
              ((path *)&result,(__cxx11 *)args.data_,
               (basic_string_view<char,_std::char_traits<char>_> *)args.size_);
    std::filesystem::__cxx11::path::filename((path *)&nearest,(path *)&result);
    std::__cxx11::string::string((string *)&local_c8,(string *)&nearest);
    std::__cxx11::string::operator=((string *)&this->programName,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::filesystem::__cxx11::path::~path((path *)&nearest);
    std::filesystem::__cxx11::path::~path((path *)&result);
    local_60 = nonstd::span_lite::
               span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
               ::subspan(&local_60,1,0xffffffffffffffff);
  }
  sVar8 = local_60.size_;
  pbVar12 = local_60.data_;
  hadUnknowns = false;
  local_168 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  lVar11 = 0;
  local_16c = (uint)local_170 >> 0x18 & 1;
  local_f0.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
  local_f8 = (_Base_ptr)0x0;
  local_e8.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
  local_e0 = (_Base_ptr)0x0;
  _Var9 = _S_red;
  local_160 = 0;
  pOVar7 = (Option *)0x0;
  do {
    if (sVar8 * 0x10 == lVar11) {
      if (pOVar7 != (Option *)0x0) {
        nearest._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
        nearest._M_string_length = (this->programName)._M_string_length;
        nearest.field_2._M_allocated_capacity = (size_type)local_e8;
        nearest.field_2._8_8_ = local_e0;
        fmt_03.size_ = 0xdd;
        fmt_03.data_ = (char *)0x27;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)&nearest;
        ::fmt::v9::vformat_abi_cxx11_
                  (&result,(v9 *)"{}: no value provided for argument \'{}\'",fmt_03,args_04);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_168,&result);
        std::__cxx11::string::~string((string *)&result);
      }
      if ((((this->positional).
            super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) && (local_f8 != (_Base_ptr)0x0)) && (hadUnknowns == false)) {
        nearest._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
        nearest._M_string_length = (this->programName)._M_string_length;
        nearest.field_2._M_allocated_capacity = (size_type)local_f0;
        nearest.field_2._8_8_ = local_f8;
        fmt_04.size_ = 0xdd;
        fmt_04.data_ = (char *)0x38;
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)&nearest;
        ::fmt::v9::vformat_abi_cxx11_
                  (&result,(v9 *)"{}: positional arguments are not allowed (see e.g. \'{}\')",fmt_04
                   ,args_05);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_168,&result);
        std::__cxx11::string::~string((string *)&result);
      }
      return (this->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
    psVar1 = (string_view *)((long)&pbVar12->_M_len + lVar11);
    local_188._M_len = psVar1->_M_len;
    aVar10 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
              )psVar1->_M_str;
    __x._M_len = psVar1->_M_len;
    __x._M_str = psVar1->_M_str;
    local_188._M_str = (char *)aVar10;
    if (_Var9 == _S_red) {
      if (pOVar7 == (Option *)0x0) {
        if ((local_188._M_len < (_Base_ptr)0x2 || (local_160 & 1) != 0) ||
           ((((aVar10.values_)->field_0).bool_value != true &&
            (((aVar10.values_)->field_0).bool_value != true)))) {
          if (local_f8 == (_Base_ptr)0x0) {
            local_f8 = (_Base_ptr)local_188._M_len;
            local_f0 = aVar10;
          }
          pOVar7 = (this->positional).
                   super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if (pOVar7 == (Option *)0x0) goto LAB_00195794;
          _Var9 = _S_red;
          Option::set_abi_cxx11_
                    (&local_50,pOVar7,(string_view)(ZEXT816(0x344831) << 0x40),*psVar1,
                     SUB41(local_16c,0));
          std::__cxx11::string::~string((string *)&local_50);
          in_R9 = aVar10;
        }
        else {
          __y._M_str = "--";
          __y._M_len = 2;
          bVar3 = std::operator==(__x,__y);
          if (bVar3) {
            local_160 = CONCAT71(extraout_var,1);
            goto LAB_00195794;
          }
          in_R9 = aVar10;
          if ((this->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00195912:
            if ((this->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&nearest,&local_188,(allocator<char> *)&result);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&(this->cmdRename)._M_t,&nearest);
              std::__cxx11::string::~string((string *)&nearest);
              if ((_Rb_tree_header *)iVar6._M_node !=
                  &(this->cmdRename)._M_t._M_impl.super__Rb_tree_header) {
                local_188._M_str =
                     (char *)((anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                               *)(iVar6._M_node + 2))->values_;
                local_188._M_len = (size_t)iVar6._M_node[2]._M_parent;
              }
            }
            if (((anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
                  *)local_188._M_str)->bool_value != true) {
              local_d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                   (&local_188,1,0xffffffffffffffff);
              cVar2 = *local_d8._M_str;
              if (cVar2 == '-') {
                local_d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                     (&local_d8,1,0xffffffffffffffff);
              }
              value._M_len = 0;
              value._M_str = (char *)0x0;
              pOVar7 = findOption(this,local_d8,&value);
              if ((cVar2 == '-') || (pOVar7 != (Option *)0x0)) {
                if (pOVar7 == (Option *)0x0) goto LAB_00195af7;
LAB_00195a68:
                if ((value._M_len != 0) ||
                   (*(__index_type *)
                     ((long)&(pOVar7->storage).
                             super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                             .
                             super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                             .
                             super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                             .
                             super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                             .
                             super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                             .
                             super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                     + 0x20) == '\0')) {
                  name._M_str = local_188._M_str;
                  name._M_len = local_188._M_len;
                  value_00._M_str = value._M_str;
                  value_00._M_len = value._M_len;
                  in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                           )value._M_str;
                  Option::set_abi_cxx11_(&result,pOVar7,name,value_00,SUB41(local_16c,0));
                  if (result._M_string_length != 0) {
                    nearest._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
                    nearest._M_string_length = (this->programName)._M_string_length;
                    nearest.field_2._M_allocated_capacity = (size_type)result._M_dataplus._M_p;
                    nearest.field_2._8_8_ = result._M_string_length;
                    __return_storage_ptr__ = &local_c8;
                    fmt_00.size_ = 0xdd;
                    fmt_00.data_ = (char *)0x6;
                    args_01.field_1.values_ = in_R9.values_;
                    args_01.desc_ = (unsigned_long_long)&nearest;
                    ::fmt::v9::vformat_abi_cxx11_
                              (__return_storage_ptr__,(v9 *)"{}: {}",fmt_00,args_01);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>(local_168,__return_storage_ptr__);
                    goto LAB_00195bb6;
                  }
                  goto LAB_00195bbe;
                }
                local_e0 = (_Base_ptr)local_188._M_len;
                local_e8.values_ =
                     (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)
                     local_188._M_str;
              }
              else {
                pOVar7 = tryGroupOrPrefix(this,&local_d8,&value,local_170);
                if (pOVar7 != (Option *)0x0) {
                  local_188._M_len = local_d8._M_len;
                  local_188._M_str = local_d8._M_str;
                  goto LAB_00195a68;
                }
LAB_00195af7:
                __return_storage_ptr__ = &nearest;
                nearest._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
                nearest._M_string_length = (this->programName)._M_string_length;
                nearest.field_2._M_allocated_capacity = (size_type)local_188._M_str;
                nearest.field_2._8_8_ = local_188._M_len;
                fmt_01.size_ = 0xdd;
                fmt_01.data_ = (char *)0x26;
                args_02.field_1.values_ = in_R9.values_;
                args_02.desc_ = (unsigned_long_long)__return_storage_ptr__;
                ::fmt::v9::vformat_abi_cxx11_
                          (&result,(v9 *)"{}: unknown command line argument \'{}\'",fmt_01,args_02);
                arg._M_str = local_188._M_str;
                arg._M_len = local_188._M_len;
                findNearestMatch_abi_cxx11_(__return_storage_ptr__,this,arg);
                if (nearest._M_string_length != 0) {
                  local_78 = nearest._M_dataplus._M_p;
                  local_70 = nearest._M_string_length;
                  fmt_02.size_ = 0xd;
                  fmt_02.data_ = (char *)0x14;
                  args_03.field_1.values_ = in_R9.values_;
                  args_03.desc_ = (unsigned_long_long)&local_78;
                  ::fmt::v9::vformat_abi_cxx11_
                            (&local_c8,(v9 *)", did you mean \'{}\'?",fmt_02,args_03);
                  std::__cxx11::string::append((string *)&result);
                  std::__cxx11::string::~string((string *)&local_c8);
                }
                hadUnknowns = true;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_168,&result);
LAB_00195bb6:
                std::__cxx11::string::~string((string *)__return_storage_ptr__);
LAB_00195bbe:
                std::__cxx11::string::~string((string *)&result);
                pOVar7 = (Option *)0x0;
              }
              _Var9 = _S_red;
              local_160 = 0;
              goto LAB_00195798;
            }
            arg_00._M_str = local_188._M_str;
            arg_00._M_len = local_188._M_len;
            handlePlusArg(this,arg_00,local_170,&hadUnknowns);
            _Var9 = _S_red;
          }
          else {
            result._M_string_length = (size_type)local_188._M_str;
            result._M_dataplus._M_p = (pointer)local_188._M_len;
            if (((anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
                  *)local_188._M_str)->bool_value == true) {
              nearest._0_16_ =
                   std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_188,1,0xffffffffffffffff);
              sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                ((basic_string_view<char,_std::char_traits<char>_> *)&nearest,'+',0)
              ;
              in_R9 = aVar10;
              if (sVar4 != 0xffffffffffffffff) {
                result._0_16_ =
                     std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&local_188,0,sVar4 + 1);
                in_R9 = aVar10;
              }
            }
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&nearest,
                       (basic_string_view<char,_std::char_traits<char>_> *)&result,
                       (allocator<char> *)&local_c8);
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&(this->cmdIgnore)._M_t,&nearest);
            std::__cxx11::string::~string((string *)&nearest);
            if ((_Rb_tree_header *)iVar5._M_node ==
                &(this->cmdIgnore)._M_t._M_impl.super__Rb_tree_header) goto LAB_00195912;
            _Var9 = iVar5._M_node[2]._M_color;
          }
          local_160 = 0;
        }
      }
      else {
        name_00._M_str = (char *)local_e8.values_;
        name_00._M_len = (size_t)local_e0;
        Option::set_abi_cxx11_(&result,pOVar7,name_00,*psVar1,SUB41(local_16c,0));
        if (result._M_string_length != 0) {
          nearest._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
          nearest._M_string_length = (this->programName)._M_string_length;
          nearest.field_2._M_allocated_capacity = (size_type)result._M_dataplus._M_p;
          nearest.field_2._8_8_ = result._M_string_length;
          fmt.size_ = 0xdd;
          fmt.data_ = (char *)0x6;
          args_00.field_1.values_ = aVar10.values_;
          args_00.desc_ = (unsigned_long_long)&nearest;
          ::fmt::v9::vformat_abi_cxx11_(&local_c8,(v9 *)"{}: {}",fmt,args_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_168,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        std::__cxx11::string::~string((string *)&result);
LAB_00195794:
        _Var9 = _S_red;
        in_R9 = aVar10;
      }
      pOVar7 = (Option *)0x0;
    }
    else {
      _Var9 = _Var9 - _S_black;
    }
LAB_00195798:
    lVar11 = lVar11 + 0x10;
  } while( true );
}

Assistant:

bool CommandLine::parse(span<const string_view> args, ParseOptions options) {
    if (optionMap.empty())
        throw std::runtime_error("No options defined");

    if (!options.ignoreProgramName) {
        if (args.empty())
            throw std::runtime_error("Expected at least one argument");

        programName = fs::path(fs::u8path(args[0])).filename().u8string();
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    string_view expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature)
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip.
        if (!cmdIgnore.empty()) {
            // If we ignore a vendor command of the form +xx ,
            // we match on any +xx+yyy command as +yy is the command's argument.
            string_view ignoreArg = arg;
            if (arg[0] == '+') {
                size_t plusIndex = arg.substr(1).find_first_of('+');
                if (plusIndex != string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex +
                                                  1); // +1 because we started from arg.substr(1)
                }
            }

            if (auto it = cmdIgnore.find(std::string(ignoreArg)); it != cmdIgnore.end()) {
                // if yes, find how many args to skip
                skip = it->second;
                continue;
            }
        }

        // Check if arg is in the list of commands to translate.
        if (!cmdRename.empty()) {
            if (auto it = cmdRename.find(std::string(arg)); it != cmdRename.end()) {
                // if yes, rename argument
                arg = it->second;
            }
        }

        // Handle plus args, which are treated differently from all others.
        if (arg[0] == '+') {
            handlePlusArg(arg, options, hadUnknowns);
            continue;
        }

        // Get the raw name without leading dashes.
        bool longName = false;
        string_view name = arg.substr(1);
        if (name[0] == '-') {
            longName = true;
            name = name.substr(1);
        }

        string_view value;
        auto option = findOption(name, value);

        // If we didn't find the option and there was only a single dash,
        // maybe this was actually a group of single-char options or a prefixed value.
        if (!option && !longName) {
            option = tryGroupOrPrefix(name, value, options);
            if (option)
                arg = name;
        }

        // If we still didn't find it, that's an error.
        if (!option) {
            // Try to find something close to give a better error message.
            auto error = fmt::format("{}: unknown command line argument '{}'"sv, programName, arg);
            auto nearest = findNearestMatch(arg);
            if (!nearest.empty())
                error += fmt::format(", did you mean '{}'?"sv, nearest);

            hadUnknowns = true;
            errors.emplace_back(std::move(error));
            continue;
        }

        // Otherwise, we found what we wanted. If we have a value already, go ahead
        // and set it. Otherwise if we're expecting a value, assume that it will come
        // in the next argument.
        if (value.empty() && option->expectsValue()) {
            expectingVal = option;
            expectingValName = arg;
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));
        }
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}